

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FSpecialFont::LoadTranslations(FSpecialFont *this)

{
  byte bVar1;
  FTexture *pic;
  long *plVar2;
  BYTE *pBVar3;
  int total_colors;
  FRemapTable *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *luminosity;
  BYTE identity [256];
  BYTE usedcolors [256];
  double *local_240;
  byte local_238 [256];
  BYTE local_138 [264];
  
  lVar6 = (long)(this->super_FFont).LastChar - (long)(this->super_FFont).FirstChar;
  lVar7 = 0;
  memset(local_138,0,0x100);
  for (lVar5 = 0; lVar5 <= lVar6; lVar5 = lVar5 + 1) {
    pic = *(FTexture **)((long)&((this->super_FFont).Chars)->Pic + lVar7);
    if (pic != (FTexture *)0x0) {
      (*pic->_vptr_FTexture[9])(pic);
      pic[1].Scale.X = 0.0;
      RecordTextureColors(pic,local_138);
    }
    lVar7 = lVar7 + 0x10;
  }
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    if (this->notranslate[lVar5] == true) {
      local_138[lVar5] = '\0';
    }
  }
  total_colors = FFont::SimpleTranslation
                           (local_138,(this->super_FFont).PatchRemap,local_238,&local_240);
  (this->super_FFont).ActiveColors = total_colors;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    if (this->notranslate[lVar5] == true) {
      (this->super_FFont).PatchRemap[lVar5] = (BYTE)total_colors;
      local_238[total_colors] = (byte)lVar5;
      total_colors = total_colors + 1;
    }
  }
  lVar7 = 0;
  for (lVar5 = 0; lVar5 <= lVar6; lVar5 = lVar5 + 1) {
    plVar2 = *(long **)((long)&((this->super_FFont).Chars)->Pic + lVar7);
    if (plVar2 != (long *)0x0) {
      pBVar3 = (this->super_FFont).PatchRemap;
      (**(code **)(*plVar2 + 0x48))(plVar2);
      plVar2[0xd] = (long)pBVar3;
    }
    lVar7 = lVar7 + 0x10;
  }
  FFont::BuildTranslations
            (&this->super_FFont,local_240,local_238,TranslationParms[0].Array,total_colors,
             (PalEntry *)0x0);
  if ((this->super_FFont).ActiveColors < total_colors) {
    for (lVar5 = 0; lVar5 < NumTextColors; lVar5 = lVar5 + 1) {
      pFVar4 = (this->super_FFont).Ranges.Array + lVar5;
      for (lVar6 = (long)(this->super_FFont).ActiveColors; lVar6 < total_colors; lVar6 = lVar6 + 1)
      {
        bVar1 = local_238[lVar6];
        pFVar4->Remap[lVar6] = bVar1;
        pFVar4->Palette[lVar6].field_0 = GPalette.BaseColors[bVar1].field_0;
        pFVar4->Palette[lVar6].field_0.field_0.a = 0xff;
      }
    }
  }
  (this->super_FFont).ActiveColors = total_colors;
  if (local_240 != (double *)0x0) {
    operator_delete__(local_240);
  }
  return;
}

Assistant:

void FSpecialFont::LoadTranslations()
{
	int count = LastChar - FirstChar + 1;
	BYTE usedcolors[256], identity[256];
	double *luminosity;
	int TotalColors;
	int i, j;

	memset (usedcolors, 0, 256);
	for (i = 0; i < count; i++)
	{
		FFontChar1 *pic = static_cast<FFontChar1 *>(Chars[i].Pic);
		if(pic)
		{
			pic->SetSourceRemap(NULL); // Force the FFontChar1 to return the same pixels as the base texture
			RecordTextureColors (pic, usedcolors);
		}
	}

	// exclude the non-translated colors from the translation calculation
	for (i = 0; i < 256; i++)
		if (notranslate[i])
			usedcolors[i] = false;

	TotalColors = ActiveColors = SimpleTranslation (usedcolors, PatchRemap, identity, &luminosity);

	// Map all untranslated colors into the table of used colors
	for (i = 0; i < 256; i++) 
	{
		if (notranslate[i])
		{
			PatchRemap[i] = TotalColors;
			identity[TotalColors] = i;
			TotalColors++;
		}
	}

	for (i = 0; i < count; i++)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar1 *>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, identity, &TranslationParms[0][0], TotalColors, NULL);

	// add the untranslated colors to the Ranges tables
	if (ActiveColors < TotalColors)
	{
		for (i = 0; i < NumTextColors; i++)
		{
			FRemapTable *remap = &Ranges[i];
			for (j = ActiveColors; j < TotalColors; ++j)
			{
				remap->Remap[j] = identity[j];
				remap->Palette[j] = GPalette.BaseColors[identity[j]];
				remap->Palette[j].a = 0xff;
			}
		}
	}
	ActiveColors = TotalColors;

	delete[] luminosity;
}